

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O0

int Cudd_DumpBlif(DdManager *dd,int n,DdNode **f,char **inames,char **onames,char *mname,FILE *fp,
                 int mv)

{
  int iVar1;
  DdNode *n_00;
  uint local_64;
  int local_60;
  int i;
  int retval;
  int nvars;
  int *sorted;
  DdNode *scan;
  DdNode *support;
  char *mname_local;
  char **onames_local;
  char **inames_local;
  DdNode **f_local;
  int n_local;
  DdManager *dd_local;
  
  iVar1 = dd->size;
  _retval = malloc((long)iVar1 << 2);
  if (_retval == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    for (local_64 = 0; (int)local_64 < iVar1; local_64 = local_64 + 1) {
      *(undefined4 *)((long)_retval + (long)(int)local_64 * 4) = 0;
    }
    n_00 = Cudd_VectorSupport(dd,f,n);
    if (n_00 != (DdNode *)0x0) {
      *(int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4) + 1;
      for (sorted = (int *)n_00; *sorted != 0x7fffffff; sorted = *(int **)(sorted + 4)) {
        *(undefined4 *)((long)_retval + (ulong)(uint)*sorted * 4) = 1;
      }
      Cudd_RecursiveDeref(dd,n_00);
      if (mname == (char *)0x0) {
        local_60 = fprintf((FILE *)fp,".model DD\n.inputs");
      }
      else {
        local_60 = fprintf((FILE *)fp,".model %s\n.inputs",mname);
      }
      if (local_60 == -1) {
        if (_retval != (void *)0x0) {
          free(_retval);
        }
        return 0;
      }
      for (local_64 = 0; (int)local_64 < iVar1; local_64 = local_64 + 1) {
        if (*(int *)((long)_retval + (long)(int)local_64 * 4) != 0) {
          if (inames == (char **)0x0) {
            local_60 = fprintf((FILE *)fp," %d",(ulong)local_64);
          }
          else {
            local_60 = fprintf((FILE *)fp," %s",inames[(int)local_64]);
          }
          if (local_60 == -1) goto LAB_00bfdd31;
        }
      }
      if (_retval != (void *)0x0) {
        free(_retval);
      }
      _retval = (void *)0x0;
      iVar1 = fprintf((FILE *)fp,"\n.outputs");
      if (iVar1 != -1) {
        for (local_64 = 0; (int)local_64 < n; local_64 = local_64 + 1) {
          if (onames == (char **)0x0) {
            local_60 = fprintf((FILE *)fp," f%d",(ulong)local_64);
          }
          else {
            local_60 = fprintf((FILE *)fp," %s",onames[(int)local_64]);
          }
          if (local_60 == -1) goto LAB_00bfdd31;
        }
        iVar1 = fprintf((FILE *)fp,"\n");
        if (((iVar1 != -1) && (iVar1 = Cudd_DumpBlifBody(dd,n,f,inames,onames,fp,mv), iVar1 != 0))
           && (iVar1 = fprintf((FILE *)fp,".end\n"), iVar1 != -1)) {
          return 1;
        }
      }
    }
  }
LAB_00bfdd31:
  if ((_retval != (void *)0x0) && (_retval != (void *)0x0)) {
    free(_retval);
  }
  return 0;
}

Assistant:

int
Cudd_DumpBlif(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  char * mname /* model name (or NULL) */,
  FILE * fp /* pointer to the dump file */,
  int mv /* 0: blif, 1: blif-MV */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->size;
    int         retval;
    int         i;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Write the header (.model .inputs .outputs). */
    if (mname == NULL) {
        retval = fprintf(fp,".model DD\n.inputs");
    } else {
        retval = fprintf(fp,".model %s\n.inputs",mname);
    }
    if (retval == EOF) {
        ABC_FREE(sorted);
        return(0);
    }

    /* Write the input list by scanning the support array. */
    for (i = 0; i < nvars; i++) {
        if (sorted[i]) {
            if (inames == NULL) {
                retval = fprintf(fp," %d", i);
            } else {
                retval = fprintf(fp," %s", inames[i]);
            }
            if (retval == EOF) goto failure;
        }
    }
    ABC_FREE(sorted);
    sorted = NULL;

    /* Write the .output line. */
    retval = fprintf(fp,"\n.outputs");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp," f%d", i);
        } else {
            retval = fprintf(fp," %s", onames[i]);
        }
        if (retval == EOF) goto failure;
    }
    retval = fprintf(fp,"\n");
    if (retval == EOF) goto failure;

    retval = Cudd_DumpBlifBody(dd, n, f, inames, onames, fp, mv);
    if (retval == 0) goto failure;

    /* Write trailer and return. */
    retval = fprintf(fp,".end\n");
    if (retval == EOF) goto failure;

    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    return(0);

}